

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O0

void __thiscall coro_io::io_context_pool::run(io_context_pool *this)

{
  type *ptVar1;
  element_type *this_00;
  native_handle_type __th;
  size_type sVar2;
  vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
  *in_RDI;
  size_t i_1;
  int rc;
  size_t __cpu;
  cpu_set_t cpuset;
  size_t i;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> threads;
  bool ok;
  bool has_run_or_stop;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
  *in_stack_fffffffffffffed0;
  size_type sVar3;
  ostream *in_stack_fffffffffffffed8;
  ostream *in_stack_fffffffffffffee0;
  shared_ptr<asio::io_context> *in_stack_fffffffffffffef0;
  type *__args;
  size_type local_f8;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  bool *in_stack_ffffffffffffff20;
  atomic<bool> *in_stack_ffffffffffffff28;
  type *local_30;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> local_28;
  undefined1 local_a;
  undefined1 local_9;
  
  local_9 = 0;
  local_a = std::atomic<bool>::compare_exchange_strong
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                       SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),
                       (memory_order)in_stack_ffffffffffffff18);
  if ((bool)local_a) {
    std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
    vector((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *)
           0x163c24);
    local_30 = (type *)0x0;
    while (__args = local_30,
          ptVar1 = (type *)std::
                           vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                           ::size(in_RDI), __args < ptVar1) {
      std::
      vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
      ::operator[](in_RDI,(size_type)local_30);
      std::
      make_shared<std::thread,coro_io::io_context_pool::run()::_lambda(std::shared_ptr<asio::io_context>)_1_,std::shared_ptr<asio::io_context>&>
                (__args,in_stack_fffffffffffffef0);
      std::vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>::
      emplace_back<std::shared_ptr<std::thread>>
                ((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                  *)in_stack_fffffffffffffee0,(shared_ptr<std::thread> *)in_stack_fffffffffffffed8);
      std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x163ca8);
      if (((ulong)in_RDI[4].
                  super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
        memset(&stack0xffffffffffffff28,0,0x80);
        if ((ulong)local_30 >> 3 < 0x80) {
          in_stack_fffffffffffffef0 =
               (shared_ptr<asio::io_context> *)
               (1L << ((byte)local_30 & 0x3f) |
               *(ulong *)(&stack0xffffffffffffff28 + ((ulong)local_30 >> 6) * 8));
          *(shared_ptr<asio::io_context> **)(&stack0xffffffffffffff28 + ((ulong)local_30 >> 6) * 8)
               = in_stack_fffffffffffffef0;
        }
        else {
          in_stack_fffffffffffffef0 = (shared_ptr<asio::io_context> *)0x0;
        }
        std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
        back(in_stack_fffffffffffffed0);
        this_00 = std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x163d3d);
        __th = std::thread::native_handle(this_00);
        in_stack_ffffffffffffff14 =
             pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&stack0xffffffffffffff28);
        if (in_stack_ffffffffffffff14 != 0) {
          in_stack_fffffffffffffee0 =
               std::operator<<((ostream *)&std::cerr,"Error calling pthread_setaffinity_np: ");
          in_stack_fffffffffffffed8 =
               (ostream *)
               std::ostream::operator<<(in_stack_fffffffffffffee0,in_stack_ffffffffffffff14);
          std::operator<<(in_stack_fffffffffffffed8,"\n");
        }
      }
      local_30 = local_30 + 1;
    }
    local_f8 = 0;
    while (sVar3 = local_f8,
          sVar2 = std::
                  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                  ::size(&local_28), sVar3 < sVar2) {
      std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
      operator[](&local_28,local_f8);
      std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x163e56);
      std::thread::join();
      local_f8 = local_f8 + 1;
    }
    std::promise<void>::set_value
              ((promise<void> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
    ~vector((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *)
            in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void run() {
    bool has_run_or_stop = false;
    bool ok = has_run_or_stop_.compare_exchange_strong(has_run_or_stop, true);
    if (!ok) {
      return;
    }

    std::vector<std::shared_ptr<std::thread>> threads;
    for (std::size_t i = 0; i < io_contexts_.size(); ++i) {
      threads.emplace_back(std::make_shared<std::thread>(
          [](io_context_ptr svr) {
            auto ctx = get_current();
            *ctx = svr.get();
            svr->run();
          },
          io_contexts_[i]));

#ifdef __linux__
      if (cpu_affinity_) {
        cpu_set_t cpuset;
        CPU_ZERO(&cpuset);
        CPU_SET(i, &cpuset);
        int rc = pthread_setaffinity_np(threads.back()->native_handle(),
                                        sizeof(cpu_set_t), &cpuset);
        if (rc != 0) {
          std::cerr << "Error calling pthread_setaffinity_np: " << rc << "\n";
        }
      }
#endif
    }

    for (std::size_t i = 0; i < threads.size(); ++i) {
      threads[i]->join();
    }
    promise_.set_value();
  }